

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DES.cpp
# Opt level: O1

void __thiscall QMT::DES::handle_data(DES *this,uint *left,int choice)

{
  uint *right;
  uint uVar1;
  int i;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  right = left + 1;
  uVar2 = 0;
  uVar4 = 0;
  uVar3 = 0;
  do {
    if (uVar2 < 0x20) {
      iVar5 = (int)this->wz_pc1[uVar2];
      if (iVar5 < 0x21) {
        uVar6 = this->wz_pc2[(long)iVar5 + -1] & *left;
      }
      else {
        uVar6 = this->wz_pc2[iVar5 - 1] & *right;
      }
      if (uVar6 != 0) {
        uVar3 = uVar3 | this->wz_pc2[uVar2];
      }
    }
    else {
      iVar5 = (int)this->wz_pc1[uVar2];
      if (iVar5 < 0x21) {
        uVar6 = this->wz_pc2[(long)iVar5 + -1] & *left;
      }
      else {
        uVar6 = this->wz_pc2[iVar5 - 1] & *right;
      }
      if (uVar6 != 0) {
        uVar4 = uVar4 | this->wz_pc2[uVar2];
      }
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x40);
  *left = uVar3;
  left[1] = uVar4;
  if (choice == 0) {
    do {
      makedata(this,left,right,choice);
      choice = choice + 1;
    } while (choice != 0x10);
  }
  else if (choice == 1) {
    uVar4 = 0xf;
    do {
      makedata(this,left,right,uVar4);
      bVar8 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar8);
  }
  uVar4 = *left;
  uVar3 = left[1];
  *left = uVar3;
  left[1] = uVar4;
  uVar2 = 0;
  uVar6 = 0;
  uVar7 = 0;
  do {
    if (uVar2 < 0x20) {
      iVar5 = (int)this->wz_pc4[uVar2];
      if (iVar5 < 0x21) {
        uVar1 = this->wz_pc2[(long)iVar5 + -1] & uVar3;
      }
      else {
        uVar1 = this->wz_pc2[iVar5 - 1] & uVar4;
      }
      if (uVar1 != 0) {
        uVar7 = uVar7 | this->wz_pc2[uVar2];
      }
    }
    else {
      iVar5 = (int)this->wz_pc4[uVar2];
      if (iVar5 < 0x21) {
        uVar1 = this->wz_pc2[(long)iVar5 + -1] & uVar3;
      }
      else {
        uVar1 = this->wz_pc2[iVar5 - 1] & uVar4;
      }
      if (uVar1 != 0) {
        uVar6 = uVar6 | this->wz_pc2[uVar2];
      }
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x40);
  *left = uVar7;
  left[1] = uVar6;
  return;
}

Assistant:

void DES::handle_data(unsigned int *left , int choice)
  {
  	int  number = 0 ,j = 0;
  	unsigned int *right = &left[1];
  	unsigned int tmp = 0;
  	unsigned int tmpbuf[2] = { 0 };

  	for ( int i = 0; i < 64; ++i )
     {
       if ( i >= 32 )
       {
         if ( wz_pc1[i] <= 32 )
         {
           if ( wz_pc2[wz_pc1[i] - 1] & *left )
             tmpbuf[1] |= wz_pc2[i];
         }
         else if ( wz_pc2[wz_pc1[i] - 1] & *right )
         {
           tmpbuf[1] |= wz_pc2[i];
         }
       }
       else if ( wz_pc1[i] <= 32 )
       {
         if ( wz_pc2[wz_pc1[i] - 1] & *left )
           tmpbuf[0] |= wz_pc2[i];
       }
       else if ( wz_pc2[wz_pc1[i] - 1] & *right )
       {
         tmpbuf[0] |= wz_pc2[i];
       }
     }
  	*left  = tmpbuf[0];
  	*right = tmpbuf[1];
  	tmpbuf[0] = 0;
  	tmpbuf[1] = 0;
      switch(choice )
  	{
  		case DESENCRY:
  			for (number = 0; number < 16; number++)
  			{
  				makedata(left , right , (unsigned long)number);
  			}
  			break;
  		case DESDECRY:
  			for (number = 15; number >= 0; number--)
  			{
  				makedata(left , right ,(unsigned long)number);
  			}
  			break;
  		default:
  			break;
  	}

  	tmp = *left;
  	*left = *right;
  	*right = tmp;
  	for ( int l = 0; l < 64; ++l )
    {
      if ( l >= 32 )
      {
        if ( wz_pc4[l] <= 32 )
        {
          if ( wz_pc2[wz_pc4[l] - 1] & *left )
            tmpbuf[1] |= wz_pc2[l];
        }
        else if ( wz_pc2[wz_pc4[l] - 1] & *right )
        {
          tmpbuf[1] |= wz_pc2[l];
        }
      }
      else if ( wz_pc4[l] <= 32 )
      {
        if ( wz_pc2[wz_pc4[l] - 1] & *left )
          tmpbuf[0] |= wz_pc2[l];
      }
      else if ( wz_pc2[wz_pc4[l] - 1] & *right )
      {
        tmpbuf[0] |= wz_pc2[l];
      }
    }

  	*left =  tmpbuf[0];
  	*right = tmpbuf[1];
  }